

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O0

int __thiscall deci_FlexLexer::yyinput(deci_FlexLexer *this)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int offset;
  int c;
  deci_FlexLexer *this_local;
  
  *this->yy_c_buf_p = this->yy_hold_char;
  if (*this->yy_c_buf_p == '\0') {
    if (this->yy_c_buf_p <
        this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf + this->yy_n_chars) {
      *this->yy_c_buf_p = '\0';
    }
    else {
      iVar5 = *(int *)&this->yy_c_buf_p;
      iVar2 = *(int *)&(this->super_FlexLexer).yytext;
      this->yy_c_buf_p = this->yy_c_buf_p + 1;
      iVar4 = yy_get_next_buffer(this);
      if (iVar4 != 0) {
        if (iVar4 != 1) {
          if (iVar4 != 2) goto LAB_001251e2;
          (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
        }
        iVar5 = (*(this->super_FlexLexer)._vptr_FlexLexer[0xb])();
        if (iVar5 != 0) {
          return 0;
        }
        if (this->yy_did_buffer_switch_on_eof == 0) {
          (*(this->super_FlexLexer)._vptr_FlexLexer[7])(this,&this->yyin);
        }
        iVar5 = yyinput(this);
        return iVar5;
      }
      this->yy_c_buf_p = (this->super_FlexLexer).yytext + (iVar5 - iVar2);
    }
  }
LAB_001251e2:
  bVar1 = *this->yy_c_buf_p;
  *this->yy_c_buf_p = '\0';
  pcVar3 = this->yy_c_buf_p;
  this->yy_c_buf_p = pcVar3 + 1;
  this->yy_hold_char = pcVar3[1];
  if (bVar1 == 10) {
    (this->super_FlexLexer).yylineno = (this->super_FlexLexer).yylineno + 1;
  }
  return (uint)bVar1;
}

Assistant:

int yyFlexLexer::yyinput()
{
	int c;
    
	*(yy_c_buf_p) = (yy_hold_char);

	if ( *(yy_c_buf_p) == YY_END_OF_BUFFER_CHAR )
		{
		/* yy_c_buf_p now points to the character we want to return.
		 * If this occurs *before* the EOB characters, then it's a
		 * valid NUL; if not, then we've hit the end of the buffer.
		 */
		if ( (yy_c_buf_p) < &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[(yy_n_chars)] )
			/* This was really a NUL. */
			*(yy_c_buf_p) = '\0';

		else
			{ /* need more input */
			int offset = (int) ((yy_c_buf_p) - (yytext_ptr));
			++(yy_c_buf_p);

			switch ( yy_get_next_buffer(  ) )
				{
				case EOB_ACT_LAST_MATCH:
					/* This happens because yy_g_n_b()
					 * sees that we've accumulated a
					 * token and flags that we need to
					 * try matching the token before
					 * proceeding.  But for input(),
					 * there's no matching to consider.
					 * So convert the EOB_ACT_LAST_MATCH
					 * to EOB_ACT_END_OF_FILE.
					 */

					/* Reset buffer status. */
					yyrestart( yyin );

					/*FALLTHROUGH*/

				case EOB_ACT_END_OF_FILE:
					{
					if ( yywrap(  ) )
						return 0;

					if ( ! (yy_did_buffer_switch_on_eof) )
						YY_NEW_FILE;
#ifdef __cplusplus
					return yyinput();
#else
					return input();
#endif
					}

				case EOB_ACT_CONTINUE_SCAN:
					(yy_c_buf_p) = (yytext_ptr) + offset;
					break;
				}
			}
		}

	c = *(unsigned char *) (yy_c_buf_p);	/* cast for 8-bit char's */
	*(yy_c_buf_p) = '\0';	/* preserve yytext */
	(yy_hold_char) = *++(yy_c_buf_p);

	if ( c == '\n' )
		
    yylineno++;
;

	return c;
}